

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlistview.cpp
# Opt level: O2

void QListView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  byte *pbVar1;
  QSize *size;
  long lVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined1 uVar5;
  undefined4 uVar6;
  InterfaceType *pIVar7;
  
  if (_id == 0 && _c == InvokeMetaMethod) {
    indexesMoved((QListView *)_o,(QModelIndexList *)_a[1]);
  }
  switch(_c) {
  case ReadProperty:
    if (0xd < (uint)_id) {
      return;
    }
    break;
  case WriteProperty:
    if (0xd < (uint)_id) {
      return;
    }
    size = (QSize *)*_a;
    switch(_id) {
    case 0:
      setMovement((QListView *)_o,(size->wd).m_i);
      return;
    case 1:
      setFlow((QListView *)_o,(size->wd).m_i);
      return;
    case 2:
      setWrapping((QListView *)_o,SUB41((size->wd).m_i,0));
      return;
    case 3:
      iVar3 = (size->wd).m_i;
      lVar2 = *(long *)(_o + 8);
      pbVar1 = (byte *)(lVar2 + 0x56c);
      *pbVar1 = *pbVar1 | 0x20;
      *(int *)(lVar2 + 0x560) = iVar3;
      return;
    case 4:
      *(int *)(*(long *)(_o + 8) + 0x564) = (size->wd).m_i;
      return;
    case 5:
      setSpacing((QListView *)_o,(size->wd).m_i);
      return;
    case 6:
      setGridSize((QListView *)_o,size);
      return;
    case 7:
      setViewMode((QListView *)_o,(size->wd).m_i);
      return;
    case 8:
      setModelColumn((QListView *)_o,(size->wd).m_i);
      return;
    case 9:
      *(char *)(*(long *)(_o + 8) + 0x594) = (char)(size->wd).m_i;
      return;
    case 10:
      setBatchSize((QListView *)_o,(size->wd).m_i);
      return;
    case 0xb:
      setWordWrap((QListView *)_o,SUB41((size->wd).m_i,0));
      return;
    case 0xc:
      iVar3 = (size->wd).m_i;
      lVar2 = *(long *)(_o + 8);
      pbVar1 = (byte *)(lVar2 + 0x56c);
      *pbVar1 = *pbVar1 | 0x40;
      *(char *)(lVar2 + 0x5b4) = (char)iVar3;
      return;
    case 0xd:
      setItemAlignment((QListView *)_o,(Alignment)(size->wd).m_i);
      return;
    }
  default:
    goto switchD_0051a4d7_caseD_3;
  case IndexOfMethod:
    QtMocHelpers::indexOfMethod<void(QListView::*)(QList<QModelIndex>const&)>
              ((QtMocHelpers *)_a,(void **)indexesMoved,0,0);
    return;
  case RegisterMethodArgumentMetaType:
    if (_id == 0) {
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar7 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType;
        goto LAB_0051a6bd;
      }
    }
    else {
      puVar4 = (undefined8 *)*_a;
    }
    *puVar4 = 0;
    goto switchD_0051a4d7_caseD_3;
  }
  puVar4 = (undefined8 *)*_a;
  switch(_id) {
  case 0:
    uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x55c);
    break;
  case 1:
    uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x558);
    break;
  case 2:
    uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x548);
    goto LAB_0051a611;
  case 3:
    uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x560);
    break;
  case 4:
    uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x564);
    break;
  case 5:
    uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x54c);
    break;
  case 6:
    pIVar7 = *(InterfaceType **)(*(long *)(_o + 8) + 0x550);
LAB_0051a6bd:
    *puVar4 = pIVar7;
    return;
  case 7:
    uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x568);
    break;
  case 8:
    uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x590);
    break;
  case 9:
    uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x594);
    goto LAB_0051a611;
  case 10:
    uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x5a0);
    break;
  case 0xb:
    uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x491);
    goto LAB_0051a611;
  case 0xc:
    uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x5b4);
LAB_0051a611:
    *(undefined1 *)puVar4 = uVar5;
    return;
  case 0xd:
    uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x5b8);
  }
  *(undefined4 *)puVar4 = uVar6;
switchD_0051a4d7_caseD_3:
  return;
}

Assistant:

void QListView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QListView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->indexesMoved((*reinterpret_cast< std::add_pointer_t<QModelIndexList>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QModelIndexList >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QListView::*)(const QModelIndexList & )>(_a, &QListView::indexesMoved, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Movement*>(_v) = _t->movement(); break;
        case 1: *reinterpret_cast<Flow*>(_v) = _t->flow(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isWrapping(); break;
        case 3: *reinterpret_cast<ResizeMode*>(_v) = _t->resizeMode(); break;
        case 4: *reinterpret_cast<LayoutMode*>(_v) = _t->layoutMode(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->spacing(); break;
        case 6: *reinterpret_cast<QSize*>(_v) = _t->gridSize(); break;
        case 7: *reinterpret_cast<ViewMode*>(_v) = _t->viewMode(); break;
        case 8: *reinterpret_cast<int*>(_v) = _t->modelColumn(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->uniformItemSizes(); break;
        case 10: *reinterpret_cast<int*>(_v) = _t->batchSize(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->isSelectionRectVisible(); break;
        case 13: *reinterpret_cast<Qt::Alignment*>(_v) = _t->itemAlignment(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMovement(*reinterpret_cast<Movement*>(_v)); break;
        case 1: _t->setFlow(*reinterpret_cast<Flow*>(_v)); break;
        case 2: _t->setWrapping(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setResizeMode(*reinterpret_cast<ResizeMode*>(_v)); break;
        case 4: _t->setLayoutMode(*reinterpret_cast<LayoutMode*>(_v)); break;
        case 5: _t->setSpacing(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setGridSize(*reinterpret_cast<QSize*>(_v)); break;
        case 7: _t->setViewMode(*reinterpret_cast<ViewMode*>(_v)); break;
        case 8: _t->setModelColumn(*reinterpret_cast<int*>(_v)); break;
        case 9: _t->setUniformItemSizes(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setBatchSize(*reinterpret_cast<int*>(_v)); break;
        case 11: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 12: _t->setSelectionRectVisible(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setItemAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        default: break;
        }
    }
}